

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_bigint_mant.c
# Opt level: O3

int main(void)

{
  long lVar1;
  _PDCLIB_bigint_t bigint;
  uchar mant [33];
  _PDCLIB_bigint_t local_c0;
  undefined8 local_38;
  undefined8 uStack_30;
  uchar local_28 [24];
  
  builtin_memcpy(local_28,"33333333333333333",0x11);
  local_38 = 0x3333333333333333;
  uStack_30 = 0x3333333333333333;
  _PDCLIB_bigint_mant(&local_c0,local_28,1);
  if (local_c0.size == 1) {
    lVar1 = 0;
  }
  else {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x4a,"bigint.size == 1");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x4b,"bigint.data[ bigint.size - 1 ] == 0x01");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,2);
  if (local_c0.size == 1) {
    lVar1 = 0;
  }
  else {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x4e,"bigint.size == 1");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x4f,"bigint.data[ bigint.size - 1 ] == 0x03");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,3);
  if (local_c0.size == 1) {
    lVar1 = 0;
  }
  else {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x52,"bigint.size == 1");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x53,"bigint.data[ bigint.size - 1 ] == 0x03");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,4);
  if (local_c0.size == 1) {
    lVar1 = 0;
  }
  else {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x56,"bigint.size == 1");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x57,"bigint.data[ bigint.size - 1 ] == 0x03");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,5);
  if (local_c0.size == 1) {
    lVar1 = 0;
  }
  else {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x5a,"bigint.size == 1");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 0x13) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x5b,"bigint.data[ bigint.size - 1 ] == 0x13");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,6);
  if (local_c0.size == 1) {
    lVar1 = 0;
  }
  else {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x5e,"bigint.size == 1");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x5f,"bigint.data[ bigint.size - 1 ] == 0x33");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,7);
  if (local_c0.size == 1) {
    lVar1 = 0;
  }
  else {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x62,"bigint.size == 1");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,99,"bigint.data[ bigint.size - 1 ] == 0x33");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,8);
  if (local_c0.size == 1) {
    lVar1 = 0;
  }
  else {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x66,"bigint.size == 1");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x67,"bigint.data[ bigint.size - 1 ] == 0x33");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,0x10);
  if (local_c0.size == 1) {
    lVar1 = 0;
  }
  else {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x6a,"bigint.size == 1");
    lVar1 = local_c0.size - 1;
  }
  if (*(char *)((long)local_c0.data + lVar1 * 2 + 1) != '3') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x6b,
           "bigint.data[ bigint.size - 1 ] >> ( _PDCLIB_BIGINT_DIGIT_BITS - _PDCLIB_CHAR_BIT ) == 0x33"
          );
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,0x11);
  lVar1 = 1;
  if (local_c0.size != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x6e,"bigint.size == 2");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x6f,"bigint.data[ bigint.size - 1 ] == 0x01");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,0x12);
  lVar1 = 1;
  if (local_c0.size != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x72,"bigint.size == 2");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x73,"bigint.data[ bigint.size - 1 ] == 0x03");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,0x13);
  lVar1 = 1;
  if (local_c0.size != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x76,"bigint.size == 2");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x77,"bigint.data[ bigint.size - 1 ] == 0x03");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,0x14);
  lVar1 = 1;
  if (local_c0.size != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x7a,"bigint.size == 2");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x7b,"bigint.data[ bigint.size - 1 ] == 0x03");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,0x15);
  lVar1 = 1;
  if (local_c0.size != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x7e,"bigint.size == 2");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 0x13) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x7f,"bigint.data[ bigint.size - 1 ] == 0x13");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,0x16);
  lVar1 = 1;
  if (local_c0.size != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x82,"bigint.size == 2");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x83,"bigint.data[ bigint.size - 1 ] == 0x33");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,0x17);
  lVar1 = 1;
  if (local_c0.size != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x86,"bigint.size == 2");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x87,"bigint.data[ bigint.size - 1 ] == 0x33");
  }
  _PDCLIB_bigint_mant(&local_c0,local_28,0x18);
  lVar1 = 1;
  if (local_c0.size != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x8a,"bigint.size == 2");
    lVar1 = local_c0.size - 1;
  }
  if (local_c0.data[lVar1] != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x8b,"bigint.data[ bigint.size - 1 ] == 0x33");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    unsigned char mant[] = {
        0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33,
        0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33,
        0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33,
        0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33,
        0x33
    };
    _PDCLIB_bigint_t bigint;

    _PDCLIB_bigint_mant( &bigint, mant + 16, 1 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x01 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 2 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 3 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 4 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 5 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x13 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 6 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 7 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 8 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] >> ( _PDCLIB_BIGINT_DIGIT_BITS - _PDCLIB_CHAR_BIT ) == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 1 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x01 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 2 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 3 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 4 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 5 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x13 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 6 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 7 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 8 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );
#endif

    return TEST_RESULTS;
}